

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O0

_Bool aom_compute_mean_stddev_c
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double __x;
  double dVar1;
  double variance;
  int j;
  int i;
  int sumsq;
  int sum;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = 0;
  local_38 = 0;
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
      local_34 = (uint)*(byte *)(in_RDI + ((local_3c + in_ECX + -7) * in_ESI +
                                          local_40 + in_EDX + -7)) + local_34;
      local_38 = (uint)*(byte *)(in_RDI + ((local_3c + in_ECX + -7) * in_ESI +
                                          local_40 + in_EDX + -7)) *
                 (uint)*(byte *)(in_RDI + ((local_3c + in_ECX + -7) * in_ESI +
                                          local_40 + in_EDX + -7)) + local_38;
    }
  }
  *in_R8 = (double)local_34 / 16.0;
  __x = -*in_R8 * *in_R8 + (double)local_38;
  if (256.0 <= __x) {
    dVar1 = sqrt(__x);
    *in_R9 = 1.0 / dVar1;
  }
  else {
    *in_R9 = 0.0;
  }
  return 256.0 <= __x;
}

Assistant:

bool aom_compute_mean_stddev_c(const unsigned char *frame, int stride, int x,
                               int y, double *mean, double *one_over_stddev) {
  int sum = 0;
  int sumsq = 0;
  for (int i = 0; i < MATCH_SZ; ++i) {
    for (int j = 0; j < MATCH_SZ; ++j) {
      sum += frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)];
      sumsq += frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)] *
               frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)];
    }
  }
  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}